

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_derived_pipeline_handle
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *state,
          Value *pipelines,ResourceTag tag,VkPipeline *out_pipeline)

{
  VkPipeline pVVar1;
  DatabaseInterface *resolver_00;
  StateCreatorInterface *pSVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  Ch *__nptr;
  Number NVar6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  _Hash_node_base *p_Var9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  long lVar12;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var13;
  long *in_FS_OFFSET;
  uint64_t pipeline;
  size_t external_state_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  VkPipeline local_78;
  allocator_type local_69;
  DatabaseInterface *local_68;
  StateCreatorInterface *local_60;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  size_type local_50;
  Data local_48;
  long local_38;
  
  if (tag == RESOURCE_GRAPHICS_PIPELINE) {
    lVar12 = 0x158;
LAB_0011a14e:
    local_68 = resolver;
    __nptr = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(state);
    local_78 = (VkPipeline)strtoull(__nptr,(char **)0x0,0x10);
    if ((local_78 != (VkPipeline)0x0) && (this->resolve_derivative_pipelines == true)) {
      p_Var13 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((long)&(this->allocator).impl + lVar12);
      (*iface->_vptr_StateCreatorInterface[0xe])(iface);
      uVar8 = (ulong)local_78 % p_Var13->_M_bucket_count;
      p_Var10 = p_Var13->_M_buckets[uVar8];
      p_Var11 = (__node_base_ptr)0x0;
      if ((p_Var10 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var10->_M_nxt, p_Var11 = p_Var10,
         local_78 != (VkPipeline)p_Var10->_M_nxt[1]._M_nxt)) {
        while (p_Var10 = p_Var9, p_Var9 = p_Var10->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
          p_Var11 = (__node_base_ptr)0x0;
          if (((ulong)p_Var9[1]._M_nxt % p_Var13->_M_bucket_count != uVar8) ||
             (p_Var11 = p_Var10, local_78 == (VkPipeline)p_Var9[1]._M_nxt)) goto LAB_0011a1ef;
        }
        p_Var11 = (__node_base_ptr)0x0;
      }
LAB_0011a1ef:
      if (p_Var11 == (__node_base_ptr)0x0) {
        p_Var9 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var9 = p_Var11->_M_nxt;
      }
      local_60 = iface;
      local_58 = p_Var13;
      if (p_Var9 == (_Hash_node_base *)0x0) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(state);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_48.s,(Ch *)pipelines);
        uVar3 = local_48.n;
        NVar6.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(pipelines);
        pSVar2 = local_60;
        if (uVar3 != NVar6.i64) {
          if (tag == RESOURCE_RAYTRACING_PIPELINE) {
            bVar4 = parse_raytracing_pipeline(this,local_60,local_68,pipelines,state);
          }
          else if (tag == RESOURCE_COMPUTE_PIPELINE) {
            bVar4 = parse_compute_pipeline(this,local_60,local_68,pipelines,state);
          }
          else {
            if (tag != RESOURCE_GRAPHICS_PIPELINE) goto LAB_0011a4c2;
            bVar4 = parse_graphics_pipeline(this,local_60,local_68,pipelines,state);
          }
          if (bVar4 == false) goto LAB_0011a4c2;
          (*pSVar2->_vptr_StateCreatorInterface[0xe])(pSVar2);
          uVar8 = (ulong)local_78 % local_58->_M_bucket_count;
          p_Var10 = local_58->_M_buckets[uVar8];
          p_Var11 = (__node_base_ptr)0x0;
          if ((p_Var10 != (__node_base_ptr)0x0) &&
             (p_Var9 = p_Var10->_M_nxt, p_Var11 = p_Var10,
             local_78 != (VkPipeline)p_Var10->_M_nxt[1]._M_nxt)) {
            while (p_Var10 = p_Var9, p_Var9 = p_Var10->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
              p_Var11 = (__node_base_ptr)0x0;
              if (((ulong)p_Var9[1]._M_nxt % local_58->_M_bucket_count != uVar8) ||
                 (p_Var11 = p_Var10, local_78 == (VkPipeline)p_Var9[1]._M_nxt)) goto LAB_0011a4d6;
            }
            p_Var11 = (__node_base_ptr)0x0;
          }
LAB_0011a4d6:
          if (p_Var11 == (__node_base_ptr)0x0) {
            p_Var9 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var9 = p_Var11->_M_nxt;
          }
        }
      }
      resolver_00 = local_68;
      if (p_Var9 == (_Hash_node_base *)0x0) {
        local_50 = 0;
        if ((local_68 == (DatabaseInterface *)0x0) ||
           (iVar5 = (*local_68->_vptr_DatabaseInterface[3])(local_68,tag,local_78,&local_50,0,0),
           (char)iVar5 == '\0')) {
          pVVar1 = local_78;
          if ((*(int *)(*in_FS_OFFSET + -0x18) < 2) &&
             (bVar4 = Internal::log_thread_callback
                                (LOG_DEFAULT,
                                 "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                                 ,"Base pipeline",local_78), !bVar4)) {
            fprintf(_stderr,
                    "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                    ,"Base pipeline",pVVar1);
          }
          goto LAB_0011a4c2;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48.s,local_50,
                   &local_69);
        iVar5 = (*resolver_00->_vptr_DatabaseInterface[3])
                          (resolver_00,tag,local_78,&local_50,local_48.n.i64,0);
        pSVar2 = local_60;
        if ((char)iVar5 == '\0') {
LAB_0011a3f3:
          log_missing_resource("Base pipeline",(Hash)local_78);
        }
        else {
          bVar4 = parse(this,local_60,resolver_00,(void *)local_48.n,
                        (long)local_48.s.str - local_48._0_8_);
          if (bVar4) {
            (*pSVar2->_vptr_StateCreatorInterface[0xe])(pSVar2);
            p_Var9 = (_Hash_node_base *)0x0;
            p_Var7 = std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::_M_find_before_node
                               (local_58,(ulong)local_78 % local_58->_M_bucket_count,
                                (key_type *)&local_78,(__hash_code)local_78);
            if (p_Var7 != (__node_base_ptr)0x0) {
              p_Var9 = p_Var7->_M_nxt;
            }
            if (p_Var9 == (_Hash_node_base *)0x0) goto LAB_0011a3f3;
            if (p_Var9[2]._M_nxt != (_Hash_node_base *)0x0) {
              if (local_48.n.i64 != 0) {
                operator_delete((void *)local_48.n,local_38 - local_48._0_8_);
              }
              goto LAB_0011a20a;
            }
            log_invalid_resource("Base pipeline",(Hash)local_78);
          }
        }
        if (local_48.n.i64 != 0) {
          operator_delete((void *)local_48.n,local_38 - local_48._0_8_);
        }
        goto LAB_0011a4c2;
      }
LAB_0011a20a:
      local_78 = (VkPipeline)p_Var9[2]._M_nxt;
    }
    *out_pipeline = local_78;
    bVar4 = true;
  }
  else {
    if (tag == RESOURCE_RAYTRACING_PIPELINE) {
      lVar12 = 400;
      goto LAB_0011a14e;
    }
    if (tag == RESOURCE_COMPUTE_PIPELINE) {
      lVar12 = 0x120;
      goto LAB_0011a14e;
    }
LAB_0011a4c2:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool StateReplayer::Impl::parse_derived_pipeline_handle(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                        const Value &state, const Value &pipelines,
                                                        ResourceTag tag, VkPipeline *out_pipeline)
{
	unordered_map<Hash, VkPipeline> *replayed_pipelines = nullptr;
	if (tag == RESOURCE_GRAPHICS_PIPELINE)
		replayed_pipelines = &replayed_graphics_pipelines;
	else if (tag == RESOURCE_COMPUTE_PIPELINE)
		replayed_pipelines = &replayed_compute_pipelines;
	else if (tag == RESOURCE_RAYTRACING_PIPELINE)
		replayed_pipelines = &replayed_raytracing_pipelines;
	else
		return false;

	auto pipeline = string_to_uint64(state.GetString());
	if (pipeline > 0 && resolve_derivative_pipelines)
	{
		// This is pretty bad for multithreaded replay, but this should be very rare.
		iface.sync_threads();
		auto pipeline_iter = replayed_pipelines->find(pipeline);

		// If we don't have the pipeline, we might have it later in the array of graphics pipelines, queue up out of order.
		if (pipeline_iter == replayed_pipelines->end() && pipelines.HasMember(state.GetString()))
		{
			switch (tag)
			{
			case RESOURCE_GRAPHICS_PIPELINE:
				if (!parse_graphics_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			case RESOURCE_COMPUTE_PIPELINE:
				if (!parse_compute_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			case RESOURCE_RAYTRACING_PIPELINE:
				if (!parse_raytracing_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			default:
				return false;
			}

			iface.sync_threads();
			pipeline_iter = replayed_pipelines->find(pipeline);
		}

		// Still don't have it? Look into database.
		if (pipeline_iter == replayed_pipelines->end())
		{
			size_t external_state_size = 0;
			if (!resolver || !resolver->read_entry(tag, pipeline, &external_state_size, nullptr,
			                                       PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}

			vector<uint8_t> external_state(external_state_size);

			if (!resolver->read_entry(tag, pipeline, &external_state_size, external_state.data(),
			                          PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}

			if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
				return false;

			iface.sync_threads();
			pipeline_iter = replayed_pipelines->find(pipeline);
			if (pipeline_iter == replayed_pipelines->end())
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}
			else if (pipeline_iter->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Base pipeline", pipeline);
				return false;
			}
		}
		*out_pipeline = pipeline_iter->second;
	}
	else
		*out_pipeline = api_object_cast<VkPipeline>(pipeline);

	return true;
}